

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O2

void __thiscall
TPZReducedSpace::CreateGraphicalElement(TPZReducedSpace *this,TPZGraphMesh *grmesh,int dimension)

{
  bool bVar1;
  int matid;
  int iVar2;
  TPZGeoEl *pTVar3;
  long *plVar4;
  TPZGraphElQ2dd *this_00;
  TPZGraphElT3d *this_01;
  TPZGraphEl1dd *this_02;
  TPZGraphElT2dMapped *this_03;
  TPZGraphElPrismMapped *this_04;
  TPZGraphElPyramidMapped *this_05;
  TPZGraphElQ3dd *this_06;
  
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  plVar4 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb8
                               ))(this);
  matid = (**(code **)(*plVar4 + 0x58))(plVar4);
  iVar2 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
  bVar1 = TPZGraphMesh::Material_Is_PostProcessed(grmesh,matid);
  if ((dimension == 2) && (bVar1)) {
    if (iVar2 == 7) {
      this_03 = (TPZGraphElT2dMapped *)operator_new(0x28);
      TPZGraphElT2dMapped::TPZGraphElT2dMapped(this_03,(TPZCompEl *)this,grmesh);
    }
    else if (iVar2 == 9) {
      this_00 = (TPZGraphElQ2dd *)operator_new(0x28);
      TPZGraphElQ2dd::TPZGraphElQ2dd(this_00,(TPZCompEl *)this,grmesh);
    }
  }
  else if (dimension != 3 || !bVar1) {
    if (dimension == 1 && bVar1) {
      this_02 = (TPZGraphEl1dd *)operator_new(0x28);
      TPZGraphEl1dd::TPZGraphEl1dd(this_02,(TPZCompEl *)this,grmesh);
    }
  }
  else {
    switch(iVar2 - 0xfU >> 1 | (uint)((iVar2 - 0xfU & 1) != 0) << 0x1f) {
    case 0:
      this_01 = (TPZGraphElT3d *)operator_new(0x28);
      TPZGraphElT3d::TPZGraphElT3d(this_01,(TPZCompEl *)this,grmesh);
      break;
    case 2:
      this_05 = (TPZGraphElPyramidMapped *)operator_new(0x28);
      TPZGraphElPyramidMapped::TPZGraphElPyramidMapped(this_05,(TPZCompEl *)this,grmesh);
      break;
    case 3:
      this_04 = (TPZGraphElPrismMapped *)operator_new(0x28);
      TPZGraphElPrismMapped::TPZGraphElPrismMapped(this_04,(TPZCompEl *)this,grmesh);
      break;
    case 6:
      this_06 = (TPZGraphElQ3dd *)operator_new(0x28);
      TPZGraphElQ3dd::TPZGraphElQ3dd(this_06,(TPZCompEl *)this,grmesh);
    }
  }
  return;
}

Assistant:

void TPZReducedSpace::CreateGraphicalElement(TPZGraphMesh &grmesh, int dimension) {
	TPZGeoEl *ref = Reference();
	int matid = Material()->Id();
	int nsides = ref->NSides();
    bool to_postpro = grmesh.Material_Is_PostProcessed(matid);
	if(dimension == 2 && to_postpro){
		if(nsides == 9){
			new TPZGraphElQ2dd(this,&grmesh);
			return;
		}
		if(nsides == 7){
			new TPZGraphElT2dMapped(this,&grmesh);
			return;
		}
	}//2d
	
	if(dimension == 3 && to_postpro){
		if(nsides == 27){
			new TPZGraphElQ3dd(this,&grmesh);
			return;
		}//cube
		if(nsides == 21){
			new TPZGraphElPrismMapped(this,&grmesh);
			return;
		}//prism
		if(nsides == 15){
			new TPZGraphElT3d(this,&grmesh);
			return;
		}//tetra
		if(nsides == 19){
			new TPZGraphElPyramidMapped(this,&grmesh);
			return;
		}//pyram
	}//3d
	
	if(dimension == 1 && to_postpro){
		new TPZGraphEl1dd(this,&grmesh);
	}//1d
}